

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryGrowExpr(BinaryReaderIR *this,Index memidx)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Result RVar2;
  Expr *pEVar3;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e0;
  Location local_d8;
  Var local_b8;
  Var local_70;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_d8.field_1.field_0.last_column = 0;
  local_d8.filename._M_len = strlen(__s);
  local_d8.filename._M_str = __s;
  local_d8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_b8,memidx,&local_d8);
  pEVar3 = (Expr *)operator_new(0x88);
  Var::Var(&local_70,&local_b8);
  *(undefined8 *)((long)&(pEVar3->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar3->loc).field_1.field_1.offset + 4) = 0;
  (pEVar3->loc).filename._M_len = 0;
  (pEVar3->loc).filename._M_str = (char *)0x0;
  (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar3->type_ = MemoryGrow;
  pEVar3->_vptr_Expr = (_func_int **)&PTR__MemoryExpr_0019a860;
  Var::Var((Var *)(pEVar3 + 1),&local_70);
  Var::~Var(&local_70);
  local_e0._M_head_impl = pEVar3;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e0);
  if (local_e0._M_head_impl != (Expr *)0x0) {
    (*(local_e0._M_head_impl)->_vptr_Expr[1])();
  }
  Var::~Var(&local_b8);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryGrowExpr(Index memidx) {
  return AppendExpr(
      std::make_unique<MemoryGrowExpr>(Var(memidx, GetLocation())));
}